

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullrom_curve.cpp
# Opt level: O1

void __thiscall
embree::PrecomputedCatmullRomBasis::PrecomputedCatmullRomBasis
          (PrecomputedCatmullRomBasis *this,int dj)

{
  long lVar1;
  size_t j;
  long lVar2;
  float (*pafVar3) [17];
  float fVar4;
  float fVar5;
  float fVar6;
  
  pafVar3 = this->d3;
  lVar1 = 1;
  do {
    pafVar3 = pafVar3 + 1;
    lVar2 = 0;
    do {
      fVar5 = (float)(ulong)(dj + lVar2) / (float)lVar1;
      fVar4 = 1.0 - fVar5;
      fVar6 = fVar5 * 3.0;
      pafVar3[-0x77][lVar2] = -fVar5 * fVar4 * fVar4 * 0.5;
      pafVar3[-0x66][lVar2] = (fVar5 * fVar5 * (fVar6 + -5.0) + 2.0) * 0.5;
      pafVar3[-0x55][lVar2] = ((fVar4 * 3.0 + -5.0) * fVar4 * fVar4 + 2.0) * 0.5;
      pafVar3[-0x44][lVar2] = -fVar4 * fVar5 * fVar5 * 0.5;
      pafVar3[-0x33][lVar2] = (fVar5 * (fVar4 + fVar4) - fVar4 * fVar4) * 0.5;
      pafVar3[-0x22][lVar2] = ((fVar5 + fVar5) * (fVar6 + -5.0) + fVar5 * fVar6) * 0.5;
      pafVar3[-0x11][lVar2] = ((fVar6 + 2.0) * (fVar4 + fVar4) + fVar4 * -3.0 * fVar4) * 0.5;
      (*pafVar3)[lVar2] = (fVar4 * -2.0 * fVar5 + fVar5 * fVar5) * 0.5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x11);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x11);
  return;
}

Assistant:

PrecomputedCatmullRomBasis::PrecomputedCatmullRomBasis(int dj)
  {
    for (size_t i=1; i<=N; i++) 
    {
      for (size_t j=0; j<=N; j++) 
      {
        const float u = float(j+dj)/float(i);
        const Vec4f f = CatmullRomBasis::eval(u);
        c0[i][j] = f.x;
        c1[i][j] = f.y;
        c2[i][j] = f.z;
        c3[i][j] = f.w;
        const Vec4f d = CatmullRomBasis::derivative(u);
        d0[i][j] = d.x;
        d1[i][j] = d.y;
        d2[i][j] = d.z;
        d3[i][j] = d.w;
      }
    }
  }